

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O1

void __thiscall
deci::parser_t::basic_symbol<deci::parser_t::by_state>::clear
          (basic_symbol<deci::parser_t::by_state> *this)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)(this->super_by_state).state;
  if (lVar2 == 0) {
    iVar1 = -2;
  }
  else {
    iVar1 = (int)(char)yystos_[lVar2];
  }
  switch(iVar1) {
  case 3:
    value_type::as<double>(&this->value);
    break;
  case 4:
  case 0x39:
    value_type::destroy<std::__cxx11::string>(&this->value);
  default:
    goto switchD_0011076f_caseD_5;
  case 0x2a:
  case 0x3f:
    value_type::as<deci::ast_arg_list_t*>(&this->value);
    break;
  case 0x2b:
  case 0x2e:
    value_type::as<deci::ast_t*>(&this->value);
    break;
  case 0x2f:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
    value_type::as<deci::ast_item_t*>(&this->value);
    break;
  case 0x30:
    value_type::as<deci::ast_exit_t*>(&this->value);
  }
  (this->value).yytypeid_ = (type_info *)0x0;
switchD_0011076f_caseD_5:
  (this->super_by_state).state = '\0';
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.template destroy< ast_arg_list_t* > ();
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.template destroy< ast_exit_t* > ();
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.template destroy< ast_item_t* > ();
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.template destroy< ast_t* > ();
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.template destroy< double > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }